

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint color_tree_add(ColorTree *tree,uchar r,uchar g,uchar b,uchar a,uint index)

{
  uint uVar1;
  ColorTree *pCVar2;
  byte bVar3;
  undefined7 in_register_00000009;
  undefined3 in_register_00000011;
  uint uVar4;
  undefined3 in_register_00000031;
  undefined3 in_register_00000081;
  
  uVar4 = 0;
  do {
    if (uVar4 == 8) {
      tree->index = index;
      return 0;
    }
    bVar3 = (byte)uVar4;
    uVar1 = (uint)((CONCAT31(in_register_00000081,a) >> (uVar4 & 0x1f) & 1) != 0) +
            (CONCAT31(in_register_00000011,g) >> (bVar3 & 0x1f) & 1) * 4 +
            (CONCAT31(in_register_00000031,r) >> (bVar3 & 0x1f) & 1) * 8 +
            ((uint)CONCAT71(in_register_00000009,b) >> (bVar3 & 0x1f) & 1) * 2;
    pCVar2 = tree->children[uVar1];
    if (pCVar2 == (ColorTree *)0x0) {
      pCVar2 = (ColorTree *)malloc(0x88);
      tree->children[uVar1] = pCVar2;
      if (pCVar2 == (ColorTree *)0x0) {
        return 0x53;
      }
      color_tree_init(pCVar2);
      pCVar2 = tree->children[uVar1];
    }
    uVar4 = uVar4 + 1;
    tree = pCVar2;
  } while( true );
}

Assistant:

static unsigned color_tree_add(ColorTree* tree,
  unsigned char r, unsigned char g, unsigned char b, unsigned char a, unsigned index) {
  int bit;
  for (bit = 0; bit < 8; ++bit) {
    int i = 8 * ((r >> bit) & 1) + 4 * ((g >> bit) & 1) + 2 * ((b >> bit) & 1) + 1 * ((a >> bit) & 1);
    if (!tree->children[i]) {
      tree->children[i] = (ColorTree*)lodepng_malloc(sizeof(ColorTree));
      if (!tree->children[i]) return 83; /*alloc fail*/
      color_tree_init(tree->children[i]);
    }
    tree = tree->children[i];
  }
  tree->index = (int)index;
  return 0;
}